

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedenums.cpp
# Opt level: O3

void __thiscall OutputFile::OutputFile(OutputFile *this,string *filepath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  FILE *__stream;
  char *pcVar5;
  undefined8 extraout_RAX;
  char line [1024];
  char local_428 [2];
  char cStack_426;
  char acStack_425 [1021];
  
  paVar1 = &(this->_buffer).field_2;
  (this->_buffer)._M_dataplus._M_p = (pointer)paVar1;
  (this->_buffer)._M_string_length = 0;
  (this->_buffer).field_2._M_local_buf[0] = '\0';
  psVar2 = &this->_filepath;
  paVar3 = &(this->_filepath).field_2;
  (this->_filepath)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (filepath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,pcVar4,pcVar4 + filepath->_M_string_length);
  __stream = fopen((psVar2->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    pcVar5 = fgets(local_428,0x400,__stream);
    if (pcVar5 == (char *)0x0) {
      Error("I/O error while reading %s",(psVar2->_M_dataplus)._M_p);
      pcVar4 = (psVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar3) {
        operator_delete(pcVar4,paVar3->_M_allocated_capacity + 1);
      }
      pcVar4 = (this->_buffer)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    if (cStack_426 == ' ' && (short)_local_428 == 0x2f2f) {
      for (pcVar5 = acStack_425; (*pcVar5 != '\0' && (*pcVar5 != '\n')); pcVar5 = pcVar5 + 1) {
      }
      *pcVar5 = '\0';
    }
    fclose(__stream);
  }
  return;
}

Assistant:

OutputFile (string const& filepath) :
		_filepath (filepath)
	{
		FILE* readhandle = fopen (_filepath.c_str(), "r");

		if (readhandle)
		{
			char line[1024];

			if (fgets (line, sizeof line, readhandle) == null)
				Error ("I/O error while reading %s", _filepath.c_str());

			if (strncmp (line, "// ", 3) == 0)
			{
				// Get rid of the newline at the end
				char* cp;
				for (cp = &line[3]; *cp != '\0' and *cp != '\n'; ++cp)
					;

				*cp = '\0';
			}

			fclose (readhandle);
		}
	}